

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

uint32_t roaring_bitmap_minimum(roaring_bitmap_t *bm)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  int *piVar4;
  ulong *puVar5;
  uint8_t uVar6;
  long lVar7;
  
  if ((bm->high_low_container).size < 1) {
    return 0xffffffff;
  }
  piVar4 = (int *)*(bm->high_low_container).containers;
  uVar6 = *(bm->high_low_container).typecodes;
  if (uVar6 == '\x04') {
    uVar6 = (uint8_t)piVar4[2];
    if (uVar6 == '\x04') {
      __assert_fail("*type != SHARED_CONTAINER_TYPE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1062,
                    "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
    }
    piVar4 = *(int **)piVar4;
  }
  if ((uVar6 == '\x03') || (uVar6 == '\x02')) {
    if (*piVar4 == 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (uint)**(ushort **)(piVar4 + 2);
    }
  }
  else {
    if (uVar6 != '\x01') {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x18d8,"uint16_t container_minimum(const container_t *, uint8_t)");
    }
    puVar5 = *(ulong **)(piVar4 + 2);
    lVar7 = 0;
    do {
      uVar1 = *puVar5;
      if (uVar1 != 0) {
        lVar2 = 0;
        if (uVar1 != 0) {
          for (; (uVar1 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        uVar3 = (int)lVar2 - (int)lVar7;
        goto LAB_0011bd31;
      }
      lVar7 = lVar7 + -0x40;
      puVar5 = puVar5 + 1;
    } while (lVar7 != -0x10000);
    uVar3 = 0xffff;
  }
LAB_0011bd31:
  return (uint)*(bm->high_low_container).keys << 0x10 | uVar3 & 0xffff;
}

Assistant:

uint32_t roaring_bitmap_minimum(const roaring_bitmap_t *bm) {
    if (bm->high_low_container.size > 0) {
        container_t *c = bm->high_low_container.containers[0];
        uint8_t type = bm->high_low_container.typecodes[0];
        uint32_t key = bm->high_low_container.keys[0];
        uint32_t lowvalue = container_minimum(c, type);
        return lowvalue | (key << 16);
    }
    return UINT32_MAX;
}